

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# concurrentqueue.h
# Opt level: O3

void __thiscall
ylt::detail::moodycamel::
ConcurrentQueue<std::unique_ptr<cinatra::coro_http_client,_std::default_delete<cinatra::coro_http_client>_>,_ylt::detail::moodycamel::ConcurrentQueueDefaultTraits>
::ImplicitProducer::~ImplicitProducer(ImplicitProducer *this)

{
  FreeList<ylt::detail::moodycamel::ConcurrentQueue<std::unique_ptr<cinatra::coro_http_client,_std::default_delete<cinatra::coro_http_client>_>,_ylt::detail::moodycamel::ConcurrentQueueDefaultTraits>::Block>
  *pFVar1;
  atomic<unsigned_int> *paVar2;
  __int_type_conflict1 _Var3;
  ulong uVar4;
  ulong uVar5;
  __pointer_type pBVar6;
  __int_type _Var7;
  Block *__ptr;
  ConcurrentQueue<std::unique_ptr<cinatra::coro_http_client,_std::default_delete<cinatra::coro_http_client>_>,_ylt::detail::moodycamel::ConcurrentQueueDefaultTraits>
  *pCVar8;
  BlockIndexHeader *pBVar9;
  __pointer_type pBVar10;
  __pointer_type pBVar11;
  long lVar12;
  __pointer_type pBVar13;
  long lVar14;
  ulong uVar15;
  bool bVar16;
  
  (this->super_ProducerBase)._vptr_ProducerBase = (_func_int **)&PTR__ImplicitProducer_0034d7e8;
  uVar4 = (this->super_ProducerBase).tailIndex.super___atomic_base<unsigned_long>._M_i;
  uVar5 = (this->super_ProducerBase).headIndex.super___atomic_base<unsigned_long>._M_i;
  if (uVar5 != uVar4) {
    pBVar13 = (__pointer_type)0x0;
    uVar15 = uVar5;
    do {
      if (pBVar13 == (__pointer_type)0x0 || (uVar15 & 0x1f) == 0) {
        if (pBVar13 != (__pointer_type)0x0) {
          if (pBVar13->dynamicallyAllocated == true) {
            free(pBVar13);
          }
          else {
            pCVar8 = (this->super_ProducerBase).parent;
            LOCK();
            paVar2 = &pBVar13->freeListRefs;
            _Var3 = (paVar2->super___atomic_base<unsigned_int>)._M_i;
            (paVar2->super___atomic_base<unsigned_int>)._M_i =
                 (paVar2->super___atomic_base<unsigned_int>)._M_i + 0x80000000;
            UNLOCK();
            if (_Var3 == 0) {
              pBVar10 = (pCVar8->freeList).freeListHead._M_b._M_p;
              do {
                (pBVar13->freeListNext)._M_b._M_p = pBVar10;
                (pBVar13->freeListRefs).super___atomic_base<unsigned_int>._M_i = 1;
                pFVar1 = &pCVar8->freeList;
                LOCK();
                pBVar11 = (pFVar1->freeListHead)._M_b._M_p;
                bVar16 = pBVar10 == pBVar11;
                if (bVar16) {
                  (pFVar1->freeListHead)._M_b._M_p = pBVar13;
                  pBVar11 = pBVar10;
                }
                UNLOCK();
                if (bVar16) break;
                LOCK();
                paVar2 = &pBVar13->freeListRefs;
                _Var3 = (paVar2->super___atomic_base<unsigned_int>)._M_i;
                (paVar2->super___atomic_base<unsigned_int>)._M_i =
                     (paVar2->super___atomic_base<unsigned_int>)._M_i + 0x7fffffff;
                UNLOCK();
                pBVar10 = pBVar11;
              } while (_Var3 == 1);
            }
          }
        }
        pBVar6 = (this->blockIndex)._M_b._M_p;
        _Var7 = (pBVar6->tail).super___atomic_base<unsigned_long>._M_i;
        lVar12 = (uVar15 & 0xffffffffffffffe0) -
                 (pBVar6->index[_Var7]->key).super___atomic_base<unsigned_long>._M_i;
        lVar14 = lVar12 + 0x1f;
        if (-1 < lVar12) {
          lVar14 = lVar12;
        }
        pBVar13 = (pBVar6->index[pBVar6->capacity - 1 & (lVar14 >> 5) + _Var7]->value)._M_b._M_p;
      }
      std::unique_ptr<cinatra::coro_http_client,_std::default_delete<cinatra::coro_http_client>_>::
      ~unique_ptr((unique_ptr<cinatra::coro_http_client,_std::default_delete<cinatra::coro_http_client>_>
                   *)(pBVar13->elements + (uVar15 & 0x1f) * 8));
      uVar15 = uVar15 + 1;
    } while (uVar15 != uVar4);
  }
  __ptr = (this->super_ProducerBase).tailBlock;
  if ((__ptr != (Block *)0x0) && ((uVar4 & 0x1f) != 0 || uVar5 != uVar4)) {
    if (__ptr->dynamicallyAllocated == true) {
      free(__ptr);
    }
    else {
      pCVar8 = (this->super_ProducerBase).parent;
      LOCK();
      paVar2 = &__ptr->freeListRefs;
      _Var3 = (paVar2->super___atomic_base<unsigned_int>)._M_i;
      (paVar2->super___atomic_base<unsigned_int>)._M_i =
           (paVar2->super___atomic_base<unsigned_int>)._M_i + 0x80000000;
      UNLOCK();
      if (_Var3 == 0) {
        pBVar13 = (pCVar8->freeList).freeListHead._M_b._M_p;
        do {
          (__ptr->freeListNext)._M_b._M_p = pBVar13;
          (__ptr->freeListRefs).super___atomic_base<unsigned_int>._M_i = 1;
          pFVar1 = &pCVar8->freeList;
          LOCK();
          pBVar10 = (pFVar1->freeListHead)._M_b._M_p;
          bVar16 = pBVar13 == pBVar10;
          if (bVar16) {
            (pFVar1->freeListHead)._M_b._M_p = __ptr;
            pBVar10 = pBVar13;
          }
          UNLOCK();
          if (bVar16) break;
          LOCK();
          paVar2 = &__ptr->freeListRefs;
          _Var3 = (paVar2->super___atomic_base<unsigned_int>)._M_i;
          (paVar2->super___atomic_base<unsigned_int>)._M_i =
               (paVar2->super___atomic_base<unsigned_int>)._M_i + 0x7fffffff;
          UNLOCK();
          pBVar13 = pBVar10;
        } while (_Var3 == 1);
      }
    }
  }
  pBVar6 = (this->blockIndex)._M_b._M_p;
  while (pBVar6 != (__pointer_type)0x0) {
    pBVar9 = pBVar6->prev;
    free(pBVar6);
    pBVar6 = pBVar9;
  }
  return;
}

Assistant:

~ImplicitProducer() {
      // Note that since we're in the destructor we can assume that all
      // enqueue/dequeue operations completed already; this means that all
      // undequeued elements are placed contiguously across contiguous blocks,
      // and that only the first and last remaining blocks can be only partially
      // empty (all other remaining blocks must be completely full).

#ifdef MOODYCAMEL_CPP11_THREAD_LOCAL_SUPPORTED
      // Unregister ourselves for thread termination notification
      if (!this->inactive.load(std::memory_order_relaxed)) {
        details::ThreadExitNotifier::unsubscribe(&threadExitListener);
      }
#endif

      // Destroy all remaining elements!
      auto tail = this->tailIndex.load(std::memory_order_relaxed);
      auto index = this->headIndex.load(std::memory_order_relaxed);
      Block* block = nullptr;
      assert(index == tail || details::circular_less_than(index, tail));
      bool forceFreeLastBlock =
          index != tail;  // If we enter the loop, then the last (tail) block
                          // will not be freed
      while (index != tail) {
        if ((index & static_cast<index_t>(QUEUE_BLOCK_SIZE - 1)) == 0 ||
            block == nullptr) {
          if (block != nullptr) {
            // Free the old block
            this->parent->add_block_to_free_list(block);
          }

          block = get_block_index_entry_for_index(index)->value.load(
              std::memory_order_relaxed);
        }

        ((*block)[index])->~T();
        ++index;
      }
      // Even if the queue is empty, there's still one block that's not on the
      // free list (unless the head index reached the end of it, in which case
      // the tail will be poised to create a new block).
      if (this->tailBlock != nullptr &&
          (forceFreeLastBlock ||
           (tail & static_cast<index_t>(QUEUE_BLOCK_SIZE - 1)) != 0)) {
        this->parent->add_block_to_free_list(this->tailBlock);
      }

      // Destroy block index
      auto localBlockIndex = blockIndex.load(std::memory_order_relaxed);
      if (localBlockIndex != nullptr) {
        for (size_t i = 0; i != localBlockIndex->capacity; ++i) {
          localBlockIndex->index[i]->~BlockIndexEntry();
        }
        do {
          auto prev = localBlockIndex->prev;
          localBlockIndex->~BlockIndexHeader();
          (Traits::free)(localBlockIndex);
          localBlockIndex = prev;
        } while (localBlockIndex != nullptr);
      }
    }